

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

PolymorphicMatcher<testing::internal::MatchesRegexMatcher> * __thiscall
testing::ContainsRegex<char_const*>
          (PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *__return_storage_ptr__,
          testing *this,StringLike<const_char_*> *regex)

{
  RE *this_00;
  allocator<char> local_41;
  char *local_40 [4];
  
  this_00 = (RE *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,*(char **)this,&local_41);
  internal::RE::Init(this_00,local_40[0]);
  ContainsRegex(__return_storage_ptr__,this_00);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::MatchesRegexMatcher> ContainsRegex(
    const internal::StringLike<T>& regex) {
  return ContainsRegex(new internal::RE(std::string(regex)));
}